

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_mathtypes.cpp
# Opt level: O2

void tst_vec2(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"void tst_vec2()");
  poVar1 = std::operator<<(poVar1,": ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void tst_vec2()
{
    vec2 a(1, 2);
    vec2 b(3, 4);

    vec2 r = a + b;
    assert(r.x == 4);
    assert(r.y == 6);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}